

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFE.cpp
# Opt level: O1

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::HFE::get_track_at_position(HFE *this,Address address)

{
  FileHolder *this_00;
  byte bVar1;
  undefined8 uVar2;
  HFE *pHVar3;
  uint16_t uVar4;
  int iVar5;
  size_t in_RCX;
  Address in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  ulong uVar7;
  ulong uVar8;
  void *pvVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  shared_ptr<Storage::Disk::Track> sVar14;
  vector<unsigned_char,_std::allocator<unsigned_char>_> section;
  PCMSegment segment;
  undefined1 local_b1;
  undefined1 local_b0 [40];
  vector<bool,_std::allocator<bool>_> local_88;
  void *pvStack_60;
  undefined4 local_58;
  __blksize_t local_50;
  undefined4 local_48;
  long local_40;
  HFE *local_38;
  
  local_b0._32_8_ = 0x100000001;
  local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_50 = 0;
  local_48 = 0;
  local_40 = 0;
  local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  pvStack_60 = (void *)0x0;
  local_58 = 0;
  this_00 = (FileHolder *)((long)address + 8);
  local_b0._24_8_ = FileHolder::get_file_access_mutex(this_00);
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)local_b0._24_8_);
  if (iVar5 == 0) {
    local_38 = this;
    uVar4 = seek_track((HFE *)address,in_RDX);
    std::vector<bool,_std::allocator<bool>_>::resize(&local_88,(ulong)((uint)uVar4 * 8),false);
    if (uVar4 != 0) {
      uVar7 = 0;
      do {
        uVar12 = (uint)uVar4 - (int)uVar7;
        if (0xff < (int)uVar12) {
          uVar12 = 0x100;
        }
        FileHolder::read((FileHolder *)local_b0,(int)this_00,(void *)(ulong)(ushort)uVar12,in_RCX);
        if ((uVar12 & 0xffff) != 0) {
          uVar8 = uVar7 * 8;
          pvVar9 = (void *)0x0;
          do {
            bVar1 = (byte)uVar8;
            uVar11 = 1L << (bVar1 & 0x38);
            uVar10 = uVar7 + (long)pvVar9 >> 3;
            if ((*(byte *)((long)&((Track *)local_b0._0_8_)->_vptr_Track + (long)pvVar9) & 1) == 0)
            {
              uVar11 = ~uVar11 & local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                 [uVar10];
            }
            else {
              uVar11 = uVar11 | local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                [uVar10];
            }
            uVar13 = 2L << (bVar1 & 0x38);
            local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar10] = uVar11;
            if ((*(byte *)((long)&((Track *)local_b0._0_8_)->_vptr_Track + (long)pvVar9) & 2) == 0)
            {
              uVar13 = ~uVar13 & local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                 [uVar10];
            }
            else {
              uVar13 = uVar13 | local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                [uVar10];
            }
            uVar11 = 4L << (bVar1 & 0x38);
            local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar10] = uVar13;
            if ((*(byte *)((long)&((Track *)local_b0._0_8_)->_vptr_Track + (long)pvVar9) & 4) == 0)
            {
              uVar11 = ~uVar11 & local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                 [uVar10];
            }
            else {
              uVar11 = uVar11 | local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                [uVar10];
            }
            uVar13 = 8L << (bVar1 & 0x38);
            local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar10] = uVar11;
            if ((*(byte *)((long)&((Track *)local_b0._0_8_)->_vptr_Track + (long)pvVar9) & 8) == 0)
            {
              uVar13 = ~uVar13 & local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                 [uVar10];
            }
            else {
              uVar13 = uVar13 | local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                [uVar10];
            }
            uVar11 = 0x10L << (bVar1 & 0x38);
            local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar10] = uVar13;
            if ((*(byte *)((long)&((Track *)local_b0._0_8_)->_vptr_Track + (long)pvVar9) & 0x10) ==
                0) {
              uVar11 = ~uVar11 & local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                 [uVar10];
            }
            else {
              uVar11 = uVar11 | local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                [uVar10];
            }
            uVar13 = 0x20L << (bVar1 & 0x38);
            local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar10] = uVar11;
            if ((*(byte *)((long)&((Track *)local_b0._0_8_)->_vptr_Track + (long)pvVar9) & 0x20) ==
                0) {
              uVar13 = ~uVar13 & local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                 [uVar10];
            }
            else {
              uVar13 = uVar13 | local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                [uVar10];
            }
            uVar11 = 0x40L << (bVar1 & 0x38);
            local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar10] = uVar13;
            if ((*(byte *)((long)&((Track *)local_b0._0_8_)->_vptr_Track + (long)pvVar9) & 0x40) ==
                0) {
              uVar11 = ~uVar11 & local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                 [uVar10];
            }
            else {
              uVar11 = uVar11 | local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                [uVar10];
            }
            in_RCX = uVar8 & 0xffffff38;
            uVar13 = 0x80L << (sbyte)in_RCX;
            local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar10] = uVar11;
            if (*(char *)((long)&((Track *)local_b0._0_8_)->_vptr_Track + (long)pvVar9) < '\0') {
              uVar13 = uVar13 | local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                [uVar10];
            }
            else {
              uVar13 = ~uVar13 & local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                 [uVar10];
            }
            local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar10] = uVar13;
            pvVar9 = (void *)((long)pvVar9 + 1);
            uVar8 = uVar8 + 8;
          } while ((void *)(ulong)(ushort)uVar12 != pvVar9);
        }
        FileHolder::seek(this_00,0x100,1);
        if ((PCMTrack *)local_b0._0_8_ != (PCMTrack *)0x0) {
          operator_delete((void *)local_b0._0_8_,local_b0._16_8_ - local_b0._0_8_);
        }
        uVar12 = uVar12 + (int)uVar7 & 0xffff;
        uVar7 = (ulong)uVar12;
      } while (uVar12 < uVar4);
    }
    pthread_mutex_unlock((pthread_mutex_t *)local_b0._24_8_);
    local_b0._0_8_ = (PCMTrack *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::Disk::PCMTrack,std::allocator<Storage::Disk::PCMTrack>,Storage::Disk::PCMSegment&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8),(PCMTrack **)local_b0,
               (allocator<Storage::Disk::PCMTrack> *)&local_b1,(PCMSegment *)(local_b0 + 0x20));
    pHVar3 = local_38;
    uVar2 = local_b0._8_8_;
    (local_38->super_DiskImage)._vptr_DiskImage = (_func_int **)local_b0._0_8_;
    (local_38->file_).file_ = (FILE *)0x0;
    local_b0._8_8_ = (pointer)0x0;
    (local_38->file_).file_ = (FILE *)uVar2;
    _Var6._M_pi = extraout_RDX;
    if (pvStack_60 != (void *)0x0) {
      operator_delete(pvStack_60,local_40 - (long)pvStack_60);
      pvStack_60 = (void *)0x0;
      local_58 = 0;
      local_50 = 0;
      local_48 = 0;
      local_40 = 0;
      _Var6._M_pi = extraout_RDX_00;
    }
    if (local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      _Var6._M_pi = extraout_RDX_01;
    }
    sVar14.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var6._M_pi;
    sVar14.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pHVar3;
    return (shared_ptr<Storage::Disk::Track>)
           sVar14.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_system_error(iVar5);
}

Assistant:

std::shared_ptr<Track> HFE::get_track_at_position(Track::Address address) {
	PCMSegment segment;
	{
		std::lock_guard lock_guard(file_.get_file_access_mutex());
		uint16_t track_length = seek_track(address);

		segment.data.resize(track_length * 8);

		// HFE tracks are stored as 256 bytes for side 1, then 256 bytes for side 2,
		// then 256 bytes for side 1, then 256 bytes for side 2, etc, until the final
		// 512-byte segment which will contain less than the full 256 bytes.
		//
		// seek_track will have advanced an extra initial 256 bytes if the address
		// refers to side 2, so the loop below can act ass though it were definitely
		// dealing with side 1.
		uint16_t c = 0;
		while(c < track_length) {
			// Decide how many bytes of at most 256 to read, and read them.
			uint16_t length = uint16_t(std::min(256, track_length - c));
			std::vector<uint8_t> section = file_.read(length);

			// Push those into the PCMSegment. In HFE the least-significant bit is
			// serialised first. TODO: move this logic to PCMSegment.
			for(uint16_t byte = 0; byte < length; ++byte) {
				const size_t base = size_t(c + byte) << 3;
				segment.data[base + 0] = !!(section[byte] & 0x01);
				segment.data[base + 1] = !!(section[byte] & 0x02);
				segment.data[base + 2] = !!(section[byte] & 0x04);
				segment.data[base + 3] = !!(section[byte] & 0x08);
				segment.data[base + 4] = !!(section[byte] & 0x10);
				segment.data[base + 5] = !!(section[byte] & 0x20);
				segment.data[base + 6] = !!(section[byte] & 0x40);
				segment.data[base + 7] = !!(section[byte] & 0x80);
			}

			// Advance the target pointer, and skip the next 256 bytes of the file
			// (which will be for the other side of the disk).
			c += length;
			file_.seek(256, SEEK_CUR);
		}
	}

	return std::make_shared<PCMTrack>(segment);
}